

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O3

RealType __thiscall OpenMD::RNEMD::SPFForceManager::getScaledDeltaU(SPFForceManager *this)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  RealType RVar5;
  shared_ptr<OpenMD::SPFData> currentSPFData;
  undefined8 *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  Snapshot::getSPFData(this->currentSnapshot_);
  dVar1 = (double)local_38[3];
  if ((0x7fefffffffffffff < (ulong)ABS(this->potentialSink_)) ||
     (0x7fefffffffffffff < (ulong)ABS(this->potentialSource_))) {
    snprintf(painCave.errMsg,2000,
             "SPFForceManager detected a numerical error in the potential\n\tenergy with a lambda value of %f. Selecting a new molecule.\n"
            );
    painCave.isFatal = 0;
    painCave.severity = 2;
    simError();
    this->hasSelectedMolecule_ = false;
    if (local_38 != (undefined8 *)OpenMD::V3Zero) {
      local_38[2] = OpenMD::V3Zero._16_8_;
      uVar3 = OpenMD::V3Zero._8_8_;
      *local_38 = OpenMD::V3Zero._0_8_;
      local_38[1] = uVar3;
    }
    local_38[3] = 0;
    *(undefined4 *)(local_38 + 4) = 0xffffffff;
  }
  RVar5 = 0.0;
  if (1e-06 <= dVar1) {
    dVar2 = pow(dVar1,(double)this->k_);
    dVar1 = pow(dVar1 - this->deltaLambda_,(double)this->k_);
    auVar4._8_4_ = SUB84(dVar1,0);
    auVar4._0_8_ = dVar2;
    auVar4._12_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar4 = minpd(_DAT_00294090,auVar4);
    RVar5 = (this->potentialSink_ - this->potentialSource_) *
            -((double)(-(ulong)(0.0 <= dVar2) & auVar4._0_8_) -
             (double)(-(ulong)(0.0 <= dVar1) & auVar4._8_8_));
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return RVar5;
}

Assistant:

RealType SPFForceManager::getScaledDeltaU() {
    std::shared_ptr<SPFData> currentSPFData = currentSnapshot_->getSPFData();

    RealType lambda = currentSPFData->lambda;

    // Some checking against unreasonable potentials
    if (std::isinf(potentialSink_) || std::isnan(potentialSink_) ||
        std::isinf(potentialSource_) || std::isnan(potentialSource_)) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "SPFForceManager detected a numerical error in the potential\n"
          "\tenergy with a lambda value of %f. Selecting a new molecule.\n",
          lambda);
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_WARNING;
      simError();

      hasSelectedMolecule_ = false;
      currentSPFData->clear();
    }

    if (lambda < 1e-6) { return 0.0; }

    return -(f_lambda(lambda) - f_lambda(lambda - deltaLambda_)) *
           (potentialSink_ - potentialSource_);
  }